

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.cxx
# Opt level: O1

int __thiscall Fl_Tree_Item::move(Fl_Tree_Item *this,Fl_Tree_Item *item,int op,int pos)

{
  Fl_Tree_Item *pFVar1;
  int iVar2;
  long lVar3;
  uint from;
  long lVar4;
  Fl_Tree_Item *pFVar5;
  Fl_Tree_Item *newparent;
  
  if (op == 2) {
    pFVar5 = this->_parent;
    lVar3 = (long)(pFVar5->_children)._total;
    from = 0xffffffff;
    newparent = item;
    if (0 < lVar3) {
      lVar4 = 0;
      do {
        if ((pFVar5->_children)._items[lVar4] == this) {
          from = (uint)lVar4;
          break;
        }
        lVar4 = lVar4 + 1;
      } while (lVar3 != lVar4);
    }
  }
  else if (op == 1) {
    pFVar5 = this->_parent;
    newparent = item->_parent;
    lVar3 = (long)(pFVar5->_children)._total;
    pos = 0xffffffff;
    lVar4 = 0xffffffff;
    if (0 < lVar3) {
      lVar4 = 0;
      do {
        if ((pFVar5->_children)._items[lVar4] == this) goto LAB_001dabeb;
        lVar4 = lVar4 + 1;
      } while (lVar3 != lVar4);
      lVar4 = 0xffffffff;
    }
LAB_001dabeb:
    from = (uint)lVar4;
    lVar3 = (long)(newparent->_children)._total;
    if (0 < lVar3) {
      lVar4 = 0;
      do {
        if ((newparent->_children)._items[lVar4] == item) goto LAB_001dac36;
        lVar4 = lVar4 + 1;
      } while (lVar3 != lVar4);
    }
  }
  else {
    if (op != 0) {
      return -3;
    }
    pFVar5 = this->_parent;
    newparent = item->_parent;
    lVar3 = (long)(pFVar5->_children)._total;
    pos = 0xffffffff;
    lVar4 = 0xffffffff;
    if (0 < lVar3) {
      lVar4 = 0;
      do {
        if ((pFVar5->_children)._items[lVar4] == this) goto LAB_001dab8d;
        lVar4 = lVar4 + 1;
      } while (lVar3 != lVar4);
      lVar4 = 0xffffffff;
    }
LAB_001dab8d:
    from = (uint)lVar4;
    lVar3 = (long)(newparent->_children)._total;
    if (0 < lVar3) {
      lVar4 = 0;
      do {
        if ((newparent->_children)._items[lVar4] == item) goto LAB_001dac36;
        lVar4 = lVar4 + 1;
      } while (lVar3 != lVar4);
    }
  }
LAB_001dac40:
  if (newparent == (Fl_Tree_Item *)0x0) {
    iVar2 = -1;
  }
  else if ((int)(pos | from) < 0) {
    iVar2 = -2;
  }
  else {
    if (pFVar5 == newparent) {
      if (op == 1) {
        if (pos < (int)from) {
          pos = pos + (uint)(pos < (newparent->_children)._total);
        }
      }
      else if (op == 0) {
        pos = pos - (uint)(0 < pos && (int)from < pos);
      }
      iVar2 = Fl_Tree_Item_Array::move(&pFVar5->_children,pos,from);
      if (iVar2 < 0) {
        return -4;
      }
    }
    else {
      if ((newparent->_children)._total < pos) {
        return -4;
      }
      pFVar1 = (pFVar5->_children)._items[(int)from];
      iVar2 = Fl_Tree_Item_Array::deparent(&pFVar5->_children,from);
      if (iVar2 < 0) {
        return -5;
      }
      if (pFVar1 == (Fl_Tree_Item *)0x0) {
        return -5;
      }
      iVar2 = Fl_Tree_Item_Array::reparent(&newparent->_children,this,newparent,pos);
      if (iVar2 < 0) {
        iVar2 = Fl_Tree_Item_Array::reparent(&newparent->_children,this,newparent,0);
        if (iVar2 < 0) {
          return -6;
        }
        this->_parent = newparent;
        return -6;
      }
      this->_parent = newparent;
    }
    iVar2 = 0;
  }
  return iVar2;
LAB_001dac36:
  pos = (int)lVar4;
  goto LAB_001dac40;
}

Assistant:

int Fl_Tree_Item::move(Fl_Tree_Item *item, int op, int pos) {
  Fl_Tree_Item *from_parent, *to_parent;
  int from, to;
  switch (op) {
    case 0:	// "above"
      from_parent = this->parent();
      to_parent   = item->parent();
      from        = from_parent->find_child(this);
      to          = to_parent->find_child(item);
      break;
    case 1:	// "below"
      from_parent = this->parent();
      to_parent   = item->parent();
      from        = from_parent->find_child(this);
      to          = to_parent->find_child(item);
      break;
    case 2:	// "into"
      from_parent = this->parent();
      to_parent   = item;
      from        = from_parent->find_child(this);
      to          = pos;
      break;
    default:
      return -3;
  }
  if ( !from_parent || !to_parent ) return -1;
  if ( from < 0 || to < 0 ) return -2;
  if ( from_parent == to_parent ) {		// same parent?
    switch (op) {				// 'to' offsets due to scroll
      case 0: if ( from < to && to > 0 ) --to; break;
      case 1: if ( from > to && to < to_parent->children() ) ++to; break;
    }
    if ( from_parent->move(to, from) < 0 )	// simple move among siblings
      return -4;
  } else {					// different parent?
    if ( to > to_parent->children() )		// try to prevent a reparent() error
      return -4;
    if ( from_parent->deparent(from) == NULL )	// deparent self from current parent
      return -5;
    if ( to_parent->reparent(this, to) < 0 ) {	// reparent self to new parent at position 'to'
      to_parent->reparent(this, 0);		// failed? shouldn't happen, reparent at 0
      return -6;
    }
  }
  return 0;
}